

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

int __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>::
linear_search_plain_compare<int,std::less<int>>
          (btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
           *this,int *k,int s,int e,less<int> *comp)

{
  int iVar1;
  long lVar2;
  
  iVar1 = s;
  if (s < e) {
    if (((ulong)this & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                    ,0x1e1,
                    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                   );
    }
    lVar2 = 0;
    do {
      if (*k <= *(int *)(this + lVar2 * 4 + (long)s * 4 + 0xc)) {
        return s + (int)lVar2;
      }
      lVar2 = lVar2 + 1;
      iVar1 = e;
    } while ((long)e - (long)s != lVar2);
  }
  return iVar1;
}

Assistant:

int linear_search_plain_compare(const K &k, int s, const int e,
                                  const Compare &comp) const {
    while (s < e) {
      if (!comp(key(s), k)) {
        break;
      }
      ++s;
    }
    return s;
  }